

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flashfader.cpp
# Opt level: O3

void __thiscall DFlashFader::Serialize(DFlashFader *this,FArchive *arc)

{
  FArchive *pFVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  bool bVar5;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FArchive::operator<<(arc,(DWORD *)&this->TotalTics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->StartTic);
  FArchive::SerializeObject(pFVar1,(DObject **)&this->ForWho,AActor::RegistrationInfo.MyClass);
  pfVar3 = this->Blends[1] + 3;
  lVar4 = 1;
  do {
    lVar2 = 0;
    do {
      FArchive::operator<<(arc,(float *)((long)pfVar3 + lVar2));
      lVar2 = lVar2 + -4;
    } while (lVar2 != -0x10);
    pfVar3 = pfVar3 + -4;
    bVar5 = lVar4 != 0;
    lVar4 = lVar4 + -1;
  } while (bVar5);
  return;
}

Assistant:

void DFlashFader::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << TotalTics << StartTic << ForWho;
	for (int i = 1; i >= 0; --i)
		for (int j = 3; j >= 0; --j)
			arc << Blends[i][j];
}